

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLFileReader<MockFile>::Read<TestNLHandler>
          (NLFileReader<MockFile> *this,CStringRef filename,TestNLHandler *handler,int flags)

{
  undefined8 in_RSI;
  NLFileReader<MockFile> *in_RDI;
  MemoryMappedFile<MockFile> mapped_file;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> array;
  undefined4 in_stack_000000a8;
  int in_stack_00000124;
  TestNLHandler *in_stack_00000128;
  CStringRef in_stack_00000130;
  undefined1 in_stack_00000138 [16];
  allocator<char> *in_stack_ffffffffffffff38;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  MemoryMappedFileBase *this_00;
  MemoryBuffer<char,_1UL,_std::allocator<char>_> *array_00;
  MockFile *in_stack_ffffffffffffff58;
  NLStringRef *in_stack_ffffffffffffff60;
  MemoryMappedFileBase local_90;
  undefined8 local_80;
  undefined1 local_51 [73];
  undefined8 local_8;
  
  local_8 = in_RSI;
  Open((NLFileReader<MockFile> *)CONCAT44(flags,in_stack_000000a8),(CStringRef)handler);
  if (in_RDI->size_ == in_RDI->rounded_size_) {
    array_00 = (MemoryBuffer<char,_1UL,_std::allocator<char>_> *)local_51;
    std::allocator<char>::allocator();
    fmt::internal::MemoryBuffer<char,_1UL,_std::allocator<char>_>::MemoryBuffer
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    Read(in_RDI,array_00);
    fmt::Buffer<char>::operator[]((Buffer<char> *)(local_51 + 1),0);
    NLStringRef::NLStringRef
              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,(size_t)in_RDI);
    local_80 = local_8;
    ReadNLString<TestNLHandler>
              ((NLStringRef)in_stack_00000138,in_stack_00000128,in_stack_00000130,in_stack_00000124)
    ;
    fmt::internal::MemoryBuffer<char,_1UL,_std::allocator<char>_>::~MemoryBuffer
              (in_stack_ffffffffffffff40);
  }
  else {
    this_00 = &local_90;
    MemoryMappedFile<MockFile>::MemoryMappedFile
              ((MemoryMappedFile<MockFile> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (size_t)in_RDI);
    MemoryMappedFileBase::start(this_00);
    NLStringRef::NLStringRef
              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,(size_t)in_RDI);
    ReadNLString<TestNLHandler>
              ((NLStringRef)in_stack_00000138,in_stack_00000128,in_stack_00000130,in_stack_00000124)
    ;
    MemoryMappedFile<MockFile>::~MemoryMappedFile((MemoryMappedFile<MockFile> *)0x18f286);
  }
  return;
}

Assistant:

void Read(fmt::CStringRef filename, Handler &handler, int flags) {
    Open(filename);
    if (size_ == rounded_size_) {
      // Don't use mmap, because the file size is a multiple of the page size
      // and therefore the mmap'ed buffer won't be null-terminated.
      fmt::internal::MemoryBuffer<char, 1> array;
      Read(array);
      return ReadNLString(
            NLStringRef(&array[0], size_), handler, filename, flags);
    }
    MemoryMappedFile<File> mapped_file(file_, rounded_size_);
    ReadNLString(
          NLStringRef(mapped_file.start(), size_), handler, filename, flags);
  }